

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O1

void FAudio_INTERNAL_DecodeMonoMSADPCM
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  FAudioWaveFormatEx *pFVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int16_t blockCache [1012];
  ushort local_818 [1012];
  
  if (samples != 0) {
    pFVar6 = (voice->field_19).src.format;
    uVar11 = (voice->field_19).src.curBufferOffset;
    uVar12 = (uint)pFVar6[1].wFormatTag;
    uVar8 = (ulong)uVar11 % (ulong)uVar12;
    pbVar7 = buffer->pAudioData + (uint)pFVar6->nBlockAlign * (uVar11 / uVar12);
    uVar11 = 0;
    do {
      uVar10 = uVar12 - (int)uVar8;
      if (samples - uVar11 < uVar10) {
        uVar10 = samples - uVar11;
      }
      uVar3 = ((voice->field_19).src.format)->nBlockAlign;
      pbVar1 = pbVar7 + 7;
      bVar2 = *pbVar7;
      uVar17 = (uint)*(ushort *)(pbVar7 + 1);
      local_818[1] = *(ushort *)(pbVar7 + 3);
      uVar15 = (uint)local_818[1];
      local_818[0] = *(ushort *)(pbVar7 + 5);
      uVar19 = (uint)local_818[0];
      pbVar7 = pbVar1;
      if (uVar3 != 7) {
        iVar4 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_1 + (ulong)bVar2 * 4);
        iVar5 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_2 + (ulong)bVar2 * 4);
        lVar13 = 0;
        do {
          uVar16 = (uint)(pbVar1[lVar13] >> 4);
          uVar9 = (ulong)(uVar16 - 0x10 & 0xff);
          if (-1 < (char)pbVar1[lVar13]) {
            uVar9 = (ulong)uVar16;
          }
          iVar14 = (short)uVar19 * iVar5 + iVar4 * (short)uVar15;
          iVar18 = iVar14 + 0xff;
          if (-1 < iVar14) {
            iVar18 = iVar14;
          }
          uVar19 = (int)(char)uVar9 * (int)(short)uVar17 + (iVar18 >> 8);
          if ((int)uVar19 < -0x7fff) {
            uVar19 = 0xffff8000;
          }
          if (0x7ffe < (int)uVar19) {
            uVar19 = 0x7fff;
          }
          uVar16 = (int)(short)uVar17 *
                   *(int *)(FAudio_INTERNAL_ParseNibble_AdaptionTable + (ulong)uVar16 * 4);
          uVar17 = uVar16 + 0xff;
          if (-1 < (int)uVar16) {
            uVar17 = uVar16;
          }
          uVar16 = uVar17 >> 8;
          if ((short)(uVar17 >> 8) < 0x11) {
            uVar16 = 0x10;
          }
          local_818[lVar13 * 2 + 2] = (ushort)uVar19;
          uVar17 = pbVar1[lVar13] & 0xf;
          iVar14 = (short)uVar15 * iVar5 + uVar19 * iVar4;
          iVar18 = iVar14 + 0xff;
          if (-1 < iVar14) {
            iVar18 = iVar14;
          }
          uVar15 = (int)(char)((char)(pbVar1[lVar13] << 4) >> 7 & 0xf0U | (byte)uVar17) *
                   (uVar16 & 0xffff) + (iVar18 >> 8);
          if ((int)uVar15 < -0x7fff) {
            uVar15 = 0xffff8000;
          }
          if (0x7ffe < (int)uVar15) {
            uVar15 = 0x7fff;
          }
          uVar17 = (uVar16 & 0xffff) *
                   *(int *)(FAudio_INTERNAL_ParseNibble_AdaptionTable + (ulong)uVar17 * 4);
          uVar16 = uVar17 + 0xff;
          if (-1 < (int)uVar17) {
            uVar16 = uVar17;
          }
          uVar17 = uVar16 >> 8;
          if ((short)(uVar16 >> 8) < 0x11) {
            uVar17 = 0x10;
          }
          local_818[lVar13 * 2 + 3] = (ushort)uVar15;
          lVar13 = lVar13 + 1;
        } while (uVar3 - 7 != (int)lVar13);
        pbVar7 = pbVar1 + lVar13;
      }
      (*FAudio_INTERNAL_Convert_S16_To_F32)((int16_t *)(local_818 + uVar8),decodeCache,uVar10);
      decodeCache = decodeCache + uVar10;
      uVar11 = uVar11 + uVar10;
      uVar8 = 0;
    } while (uVar11 < samples);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodeMonoMSADPCM(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	/* Loop variables */
	uint32_t copy, done = 0;

	/* Read pointers */
	uint8_t *buf;
	int32_t midOffset;

	/* PCM block cache */
	int16_t blockCache[1012]; /* Max block size */

	/* Block size */
	uint32_t bsize = ((FAudioADPCMWaveFormat*) voice->src.format)->wSamplesPerBlock;

	LOG_FUNC_ENTER(voice->audio)

	/* Where are we starting? */
	buf = (uint8_t*) buffer->pAudioData + (
		(voice->src.curBufferOffset / bsize) *
		voice->src.format->nBlockAlign
	);

	/* Are we starting in the middle? */
	midOffset = (voice->src.curBufferOffset % bsize);

	/* Read in each block directly to the decode cache */
	while (done < samples)
	{
		copy = FAudio_min(samples - done, bsize - midOffset);
		FAudio_INTERNAL_DecodeMonoMSADPCMBlock(
			&buf,
			blockCache,
			voice->src.format->nBlockAlign
		);
		FAudio_INTERNAL_Convert_S16_To_F32(
			blockCache + midOffset,
			decodeCache,
			copy
		);
		decodeCache += copy;
		done += copy;
		midOffset = 0;
	}
	LOG_FUNC_EXIT(voice->audio)
}